

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmem.c
# Opt level: O0

void * luaM_growaux_(lua_State *L,void *block,int nelems,int *psize,uint size_elems,int limit,
                    char *what)

{
  int iVar1;
  int local_44;
  int size;
  void *newblock;
  int limit_local;
  uint size_elems_local;
  int *psize_local;
  int nelems_local;
  void *block_local;
  lua_State *L_local;
  
  iVar1 = *psize;
  L_local = (lua_State *)block;
  if (iVar1 < nelems + 1) {
    if (iVar1 < limit / 2) {
      local_44 = iVar1 << 1;
      if (local_44 < 4) {
        local_44 = 4;
      }
    }
    else {
      local_44 = limit;
      if (limit <= iVar1) {
        luaG_runerror(L,"too many %s (limit is %d)",what,(ulong)(uint)limit);
      }
    }
    L_local = (lua_State *)
              luaM_saferealloc_(L,block,(long)*psize * (ulong)size_elems,
                                (long)local_44 * (ulong)size_elems);
    *psize = local_44;
  }
  return L_local;
}

Assistant:

void *luaM_growaux_ (lua_State *L, void *block, int nelems, int *psize,
                     unsigned size_elems, int limit, const char *what) {
  void *newblock;
  int size = *psize;
  if (nelems + 1 <= size)  /* does one extra element still fit? */
    return block;  /* nothing to be done */
  if (size >= limit / 2) {  /* cannot double it? */
    if (l_unlikely(size >= limit))  /* cannot grow even a little? */
      luaG_runerror(L, "too many %s (limit is %d)", what, limit);
    size = limit;  /* still have at least one free place */
  }
  else {
    size *= 2;
    if (size < MINSIZEARRAY)
      size = MINSIZEARRAY;  /* minimum size */
  }
  lua_assert(nelems + 1 <= size && size <= limit);
  /* 'limit' ensures that multiplication will not overflow */
  newblock = luaM_saferealloc_(L, block, cast_sizet(*psize) * size_elems,
                                         cast_sizet(size) * size_elems);
  *psize = size;  /* update only when everything else is OK */
  return newblock;
}